

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::String::String(String *this,String *b)

{
  uchar *puVar1;
  String *b_local;
  String *this_local;
  
  (this->super_tagbstring).slen = (b->super_tagbstring).slen;
  (this->super_tagbstring).mlen = (this->super_tagbstring).slen + 1;
  (this->super_tagbstring).data = (uchar *)0x0;
  if (0 < (this->super_tagbstring).mlen) {
    puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar1;
  }
  if ((this->super_tagbstring).data == (uchar *)0x0) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0xa7,"Failure in (String) constructor");
  }
  else {
    memcpy((this->super_tagbstring).data,(b->super_tagbstring).data,
           (long)(this->super_tagbstring).slen);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
  }
  return;
}

Assistant:

String::String(const String& b)
    {
        slen = b.slen;
        mlen = slen + 1;
        data = 0;
        if (mlen > 0)
            data = (uint8 * ) malloc(mlen);
        if (!data)
        {
            bstringThrow("Failure in (String) constructor");
        }
        else
        {
            memcpy(data, b.data, slen);
            data[slen] = '\0';
        }
    }